

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_bools
          (TensorValue *this,TensorValue_RepeatedBools *bools)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (bools != (TensorValue_RepeatedBools *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(bools->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      bools = (TensorValue_RepeatedBools *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,&bools->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 3;
    (this->value_).bools_ = bools;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_bools(::CoreML::Specification::MILSpec::TensorValue_RepeatedBools* bools) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (bools) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedBools>::GetOwningArena(bools);
    if (message_arena != submessage_arena) {
      bools = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, bools, submessage_arena);
    }
    set_has_bools();
    value_.bools_ = bools;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.bools)
}